

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfFunction.h
# Opt level: O2

void __thiscall
halfFunction<half>::halfFunction<half(*)(half)>
          (halfFunction<half> *this,_func_half_half *f,half domainMin,half domainMax,
          half defaultValue,half posInfValue,half negInfValue,half nanValue)

{
  float *pfVar1;
  float fVar2;
  half hVar3;
  half *phVar4;
  half hVar5;
  int i;
  ulong uVar6;
  
  phVar4 = (half *)operator_new__(0x20000);
  this->_lut = phVar4;
  uVar6 = 0;
  do {
    if (uVar6 == 0x10000) {
      return;
    }
    hVar3._h = (unsigned_short)uVar6;
    if ((uVar6 & 0x3ff) == 0 || (~(uint)uVar6 & 0x7c00) != 0) {
      if ((hVar3._h & 0x7fff) == 0x7c00) {
        hVar5._h = posInfValue._h;
        if ((short)hVar3._h < 0) {
          hVar5._h = negInfValue._h;
        }
      }
      else {
        fVar2 = *(float *)((long)&half::_toFloat + uVar6 * 4);
        hVar5._h = defaultValue._h;
        if ((*(float *)((long)&half::_toFloat + (ulong)domainMin._h * 4) <= fVar2) &&
           (pfVar1 = (float *)((long)&half::_toFloat + (ulong)domainMax._h * 4),
           fVar2 < *pfVar1 || fVar2 == *pfVar1)) {
          hVar3 = (*f)(hVar3);
          phVar4 = this->_lut;
          phVar4[uVar6]._h = hVar3._h;
          goto LAB_0015739c;
        }
      }
      phVar4[uVar6]._h = hVar5._h;
    }
    else {
      phVar4[uVar6]._h = nanValue._h;
    }
LAB_0015739c:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

halfFunction<T>::halfFunction (Function f,
			       half domainMin,
			       half domainMax,
			       T defaultValue,
			       T posInfValue,
			       T negInfValue,
			       T nanValue)
{
#ifndef ILMBASE_HAVE_LARGE_STACK
    _lut = new T[1<<16];
#endif
    
    for (int i = 0; i < (1 << 16); i++)
    {
	half x;
	x.setBits (i);

	if (x.isNan())
	    _lut[i] = nanValue;
	else if (x.isInfinity())
	    _lut[i] = x.isNegative()? negInfValue: posInfValue;
	else if (x < domainMin || x > domainMax)
	    _lut[i] = defaultValue;
	else
	    _lut[i] = f (x);
    }
}